

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

int Minisat::parseInt<Minisat::StreamBuffer>(StreamBuffer *in)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  vec<Minisat::Option_*> *this;
  string *psVar4;
  size_t sVar5;
  char *pcVar6;
  char *extraout_RDX;
  int iVar7;
  StreamBuffer *pSVar8;
  Option *pOVar9;
  char *in_R8;
  int iVar10;
  Option *unaff_R14;
  bool bVar11;
  Option *pOStack_38;
  StreamBuffer *pSStack_30;
  
  skipWhitespace<Minisat::StreamBuffer>(in);
  iVar3 = in->pos;
  uVar1 = in->size;
  pcVar6 = (char *)(ulong)uVar1;
  if (iVar3 < (int)uVar1) {
    bVar11 = in->buf[iVar3] == '-';
  }
  else {
    bVar11 = false;
  }
  if ((bVar11) || ((iVar3 < (int)uVar1 && (in->buf[iVar3] == '+')))) {
    in->pos = iVar3 + 1;
    StreamBuffer::assureLookahead(in);
  }
  iVar3 = in->pos;
  iVar10 = in->size;
  if (((iVar10 <= iVar3) || (in->buf[iVar3] < 0x30)) ||
     ((iVar3 < iVar10 && (0x39 < in->buf[iVar3])))) {
    pOVar9 = (Option *)(ulong)(iVar3 < iVar10);
    pSVar8 = in;
    parseInt<Minisat::StreamBuffer>();
    pOVar9->_vptr_Option = (_func_int **)&PTR__Option_00111c00;
    pOVar9->name = extraout_RDX;
    pOVar9->description = pcVar6;
    pOVar9->category = (char *)pSVar8;
    pOVar9->type_name = "<std::string>";
    pOVar9->dependOnNonDefaultOf = unaff_R14;
    pSStack_30 = in;
    this = Option::getOptionList();
    pOStack_38 = pOVar9;
    vec<Minisat::Option_*>::push(this,&pOStack_38);
    iVar3 = 0x111cf8;
    pOVar9->_vptr_Option = (_func_int **)&PTR__StringOption_00111cf8;
    if (in_R8 == (char *)0x0) {
      psVar4 = (string *)0x0;
    }
    else {
      psVar4 = (string *)operator_new(0x20);
      *(string **)psVar4 = psVar4 + 0x10;
      sVar5 = strlen(in_R8);
      std::__cxx11::string::_M_construct<char_const*>(psVar4,in_R8,in_R8 + sVar5);
      iVar3 = extraout_EAX;
    }
    pOVar9[1]._vptr_Option = (_func_int **)psVar4;
    pOVar9[1].name = in_R8;
    return iVar3;
  }
  iVar3 = in->pos;
  iVar10 = 0;
  bVar2 = iVar3 < in->size;
  if (iVar3 < in->size) {
    iVar10 = 0;
    do {
      if ((in->buf[iVar3] < 0x30) || ((bVar2 && (0x39 < in->buf[iVar3])))) break;
      iVar7 = -0x31;
      if (bVar2) {
        iVar7 = in->buf[iVar3] - 0x30;
      }
      iVar10 = iVar10 * 10 + iVar7;
      in->pos = iVar3 + 1;
      StreamBuffer::assureLookahead(in);
      iVar3 = in->pos;
      bVar2 = iVar3 < in->size;
    } while (iVar3 < in->size);
  }
  iVar3 = -iVar10;
  if (!bVar11) {
    iVar3 = iVar10;
  }
  return iVar3;
}

Assistant:

static int parseInt(B &in)
{
    int val = 0;
    bool neg = false;
    skipWhitespace(in);
    if (*in == '-')
        neg = true, ++in;
    else if (*in == '+')
        ++in;
    if (*in < '0' || *in > '9') fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", *in), exit(3);
    while (*in >= '0' && *in <= '9') val = val * 10 + (*in - '0'), ++in;
    return neg ? -val : val;
}